

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

void __thiscall ANN::insert_layer(ANN *this,initializer_list<unsigned_int> *n_perceptrons)

{
  uint *puVar1;
  uint index;
  uint *puVar2;
  
  puVar1 = n_perceptrons->_M_array;
  index = 0;
  for (puVar2 = puVar1; puVar2 != puVar1 + n_perceptrons->_M_len; puVar2 = puVar2 + 1) {
    insert_layer(this,index,*puVar2);
    puVar1 = n_perceptrons->_M_array;
    index = index + 1;
  }
  return;
}

Assistant:

void ANN::insert_layer(const std::initializer_list<uint>& n_perceptrons){
    uint i=0;
    for(auto it=n_perceptrons.begin();it!=n_perceptrons.end();++it){
        insert_layer(i++, *it);
    }
}